

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O1

void __thiscall chunk_guard::~chunk_guard(chunk_guard *this)

{
  uint uVar1;
  StreamReader<false,_false> *this_00;
  
  uVar1 = this->nfo->size;
  if (uVar1 != 0xffffffff) {
    this_00 = this->reader;
    Assimp::StreamReader<false,_false>::IncPtr
              (this_00,(long)(int)(uVar1 + (*(int *)&this_00->buffer - *(int *)&this_00->current)) +
                       this->cur);
  }
  return;
}

Assistant:

~chunk_guard() {
        // don't do anything if the size is not given
        if(nfo.size != static_cast<unsigned int>(-1)) {
            try {
                reader.IncPtr( static_cast< int >( nfo.size ) - reader.GetCurrentPos() + cur );
            } catch (const DeadlyImportError& ) {
                // out of limit so correct the value
                reader.IncPtr( reader.GetReadLimit() );
            }
        }
    }